

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

TabulatedBSSRDF * __thiscall
pbrt::SubsurfaceMaterial::GetBSSRDF<pbrt::UniversalTextureEvaluator>
          (void *param_1,undefined8 param_2,undefined1 (*param_3) [64],undefined8 *param_4)

{
  Vector3f wo;
  Normal3f ns;
  Point3f po;
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  TextureEvalContext ctx_02;
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  bool bVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar17 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar29 [56];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  SampledSpectrum SVar30;
  SampledSpectrum r;
  SampledSpectrum mfree;
  SampledSpectrum sig_s;
  SampledSpectrum sig_a;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 uVar31;
  int high;
  undefined4 in_stack_fffffffffffffbdc;
  undefined4 uVar32;
  int low;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 uVar33;
  undefined4 in_stack_fffffffffffffbe4;
  Float FVar34;
  SampledSpectrum *sigma_s;
  SampledSpectrum *sigma_a;
  undefined4 uVar35;
  undefined4 in_stack_fffffffffffffc24;
  SampledSpectrum *rhoEff;
  BSSRDFTable *t;
  undefined8 uVar36;
  Float eta;
  TabulatedBSSRDF *this;
  undefined1 *in_stack_fffffffffffffc58;
  float in_stack_fffffffffffffc60;
  undefined1 *in_stack_fffffffffffffc78;
  float in_stack_fffffffffffffc80;
  float fVar37;
  undefined4 uStack_35c;
  SpectrumTexture *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  undefined8 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  undefined8 in_stack_fffffffffffffd08;
  undefined8 in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd28 [12];
  undefined1 auVar38 [12];
  undefined8 in_stack_fffffffffffffd34;
  SampledWavelengths in_stack_fffffffffffffd40;
  undefined1 auStack_298 [12];
  undefined1 local_280 [8];
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_240;
  undefined1 auStack_238 [12];
  undefined1 local_22c [52];
  undefined1 auStack_1f8 [12];
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  SampledSpectrum *local_1a8;
  BSSRDFTable *pBStack_1a0;
  undefined8 uStack_198;
  TabulatedBSSRDF *pTStack_190;
  undefined1 auStack_188 [12];
  undefined1 local_17c [52];
  undefined1 auStack_148 [12];
  undefined1 local_130 [8];
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined1 auStack_d8 [12];
  undefined1 local_cc [52];
  undefined1 auStack_98 [12];
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 *local_20;
  undefined1 (*local_18) [64];
  undefined8 local_10;
  undefined1 local_1;
  
  fVar37 = (float)param_2;
  uStack_35c = (undefined4)((ulong)param_2 >> 0x20);
  local_20 = param_4;
  local_18 = param_3;
  local_10 = param_2;
  SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x8b1cfc);
  SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x8b1d09);
  bVar3 = pbrt::TaggedPointer::operator_cast_to_bool
                    ((TaggedPointer *)(CONCAT44(uStack_35c,fVar37) + 0x10));
  if ((bVar3) &&
     (bVar3 = pbrt::TaggedPointer::operator_cast_to_bool
                        ((TaggedPointer *)(CONCAT44(uStack_35c,fVar37) + 0x18)), bVar3)) {
    SpectrumTexture::SpectrumTexture
              ((SpectrumTexture *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
               (SpectrumTexture *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    auVar4 = vmovdqu64_avx512f(*local_18);
    auVar5 = vmovdqu64_avx512f(*(undefined1 (*) [64])(*local_18 + 0xc));
    auVar5 = vmovdqu64_avx512f(auVar5);
    auStack_98 = auVar5._52_12_;
    auVar5 = vmovdqu64_avx512f(auVar4);
    auStack_d8 = auVar5._0_12_;
    local_cc = auVar5._12_52_;
    local_f8 = *local_20;
    uStack_f0 = local_20[1];
    uStack_e8 = local_20[2];
    uStack_e0 = local_20[3];
    auVar6 = vmovdqu64_avx512f(auVar5);
    auVar4._52_12_ = auStack_98;
    auVar4._0_52_ = local_cc;
    auVar4 = vmovdqu64_avx512f(auVar4);
    vmovdqu64_avx512f(auVar4);
    auVar5 = vmovdqu64_avx512f(auVar6);
    uVar31 = auVar5._0_4_;
    uVar32 = auVar5._4_4_;
    uVar33 = auVar5._8_4_;
    FVar34 = auVar5._12_4_;
    in_stack_fffffffffffffc78 = &local_1;
    auVar17 = ZEXT856(auVar6._8_8_);
    auVar29 = ZEXT856(auVar4._8_8_);
    ctx.p.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffcf4;
    ctx.p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffcf0;
    ctx.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffcf8;
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
         (float)(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffd00;
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)in_stack_fffffffffffffd04;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffd08;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffd08 >> 0x20);
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)in_stack_fffffffffffffd10;
    ctx.n.super_Tuple3<pbrt::Normal3,_float>.x =
         (float)(int)((ulong)in_stack_fffffffffffffd10 >> 0x20);
    ctx.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)in_stack_fffffffffffffd18;
    ctx.n.super_Tuple3<pbrt::Normal3,_float>.z =
         (float)(int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
    ctx.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_fffffffffffffd20;
    ctx.uv.super_Tuple2<pbrt::Point2,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffd20 >> 0x20);
    ctx.dudx = (Float)in_stack_fffffffffffffd28._0_4_;
    ctx.dudy = (Float)in_stack_fffffffffffffd28._4_4_;
    ctx.dvdx = (Float)in_stack_fffffffffffffd28._8_4_;
    ctx.dvdy = (Float)(int)in_stack_fffffffffffffd34;
    ctx.faceIndex = (int)((ulong)in_stack_fffffffffffffd34 >> 0x20);
    SVar30 = UniversalTextureEvaluator::operator()
                       ((UniversalTextureEvaluator *)
                        CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        in_stack_fffffffffffffcc8,ctx,in_stack_fffffffffffffd40);
    auVar18._0_8_ = SVar30.values.values._8_8_;
    auVar18._8_56_ = auVar29;
    auVar6._0_8_ = SVar30.values.values._0_8_;
    auVar6._8_56_ = auVar17;
    auVar17 = (undefined1  [56])0x0;
    local_78 = vmovlpd_avx(auVar6._0_16_);
    local_70 = vmovlpd_avx(auVar18._0_16_);
    SVar30 = pbrt::operator*(FVar34,(SampledSpectrum *)CONCAT44(uVar32,uVar31));
    auVar19._0_8_ = SVar30.values.values._8_8_;
    auVar19._8_56_ = auVar29;
    auVar7._0_8_ = SVar30.values.values._0_8_;
    auVar7._8_56_ = auVar17;
    local_68 = vmovlpd_avx(auVar7._0_16_);
    local_60 = vmovlpd_avx(auVar19._0_16_);
    SVar30 = ClampZero((SampledSpectrum *)CONCAT44(FVar34,uVar33));
    auVar20._0_8_ = SVar30.values.values._8_8_;
    auVar20._8_56_ = auVar29;
    auVar8._0_8_ = SVar30.values.values._0_8_;
    auVar8._8_56_ = auVar17;
    local_58 = vmovlpd_avx(auVar8._0_16_);
    uStack_50 = vmovlpd_avx(auVar20._0_16_);
    in_stack_fffffffffffffc80 = SUB84(local_130,0);
    local_38 = local_58;
    uStack_30 = uStack_50;
    SpectrumTexture::SpectrumTexture
              ((SpectrumTexture *)CONCAT44(FVar34,uVar33),(SpectrumTexture *)CONCAT44(uVar32,uVar31)
              );
    auVar4 = vmovdqu64_avx512f(*local_18);
    auVar5 = vmovdqu64_avx512f(*(undefined1 (*) [64])(*local_18 + 0xc));
    auVar5 = vmovdqu64_avx512f(auVar5);
    auStack_148 = auVar5._52_12_;
    auVar5 = vmovdqu64_avx512f(auVar4);
    auStack_188 = auVar5._0_12_;
    local_17c = auVar5._12_52_;
    rhoEff = (SampledSpectrum *)*local_20;
    t = (BSSRDFTable *)local_20[1];
    uVar36 = local_20[2];
    this = (TabulatedBSSRDF *)local_20[3];
    auVar4 = vmovdqu64_avx512f(auVar5);
    auVar5._52_12_ = auStack_148;
    auVar5._0_52_ = local_17c;
    auVar6 = vmovdqu64_avx512f(auVar5);
    auVar5 = vmovdqu64_avx512f(auVar6);
    uVar35 = auVar5._60_4_;
    auVar5 = vmovdqu64_avx512f(auVar4);
    uVar31 = auVar5._0_4_;
    uVar32 = auVar5._4_4_;
    uVar33 = auVar5._8_4_;
    FVar34 = auVar5._12_4_;
    auVar17 = ZEXT856(auVar4._8_8_);
    auVar29 = ZEXT856(auVar6._8_8_);
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffcf4;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffcf0;
    ctx_00.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffcf8;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
         (float)(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffd00;
    ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)in_stack_fffffffffffffd04;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffd08;
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffd08 >> 0x20);
    ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)in_stack_fffffffffffffd10;
    ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.x =
         (float)(int)((ulong)in_stack_fffffffffffffd10 >> 0x20);
    ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)in_stack_fffffffffffffd18;
    ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.z =
         (float)(int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_fffffffffffffd20;
    ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffd20 >> 0x20);
    ctx_00.dudx = (Float)in_stack_fffffffffffffd28._0_4_;
    ctx_00.dudy = (Float)in_stack_fffffffffffffd28._4_4_;
    ctx_00.dvdx = (Float)in_stack_fffffffffffffd28._8_4_;
    ctx_00.dvdy = (Float)(int)in_stack_fffffffffffffd34;
    ctx_00.faceIndex = (int)((ulong)in_stack_fffffffffffffd34 >> 0x20);
    local_1a8 = rhoEff;
    pBStack_1a0 = t;
    uStack_198 = uVar36;
    pTStack_190 = this;
    SVar30 = UniversalTextureEvaluator::operator()
                       ((UniversalTextureEvaluator *)
                        CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        in_stack_fffffffffffffcc8,ctx_00,in_stack_fffffffffffffd40);
    eta = (Float)((ulong)uVar36 >> 0x20);
    auVar21._0_8_ = SVar30.values.values._8_8_;
    auVar21._8_56_ = auVar29;
    auVar9._0_8_ = SVar30.values.values._0_8_;
    auVar9._8_56_ = auVar17;
    auVar17 = (undefined1  [56])0x0;
    local_128 = vmovlpd_avx(auVar9._0_16_);
    local_120 = vmovlpd_avx(auVar21._0_16_);
    SVar30 = pbrt::operator*(FVar34,(SampledSpectrum *)CONCAT44(uVar32,uVar31));
    auVar22._0_8_ = SVar30.values.values._8_8_;
    auVar22._8_56_ = auVar29;
    auVar10._0_8_ = SVar30.values.values._0_8_;
    auVar10._8_56_ = auVar17;
    local_118 = vmovlpd_avx(auVar10._0_16_);
    local_110 = vmovlpd_avx(auVar22._0_16_);
    SVar30 = ClampZero((SampledSpectrum *)CONCAT44(FVar34,uVar33));
    auVar23._0_8_ = SVar30.values.values._8_8_;
    auVar23._8_56_ = auVar29;
    auVar11._0_8_ = SVar30.values.values._0_8_;
    auVar11._8_56_ = auVar17;
    local_108 = vmovlpd_avx(auVar11._0_16_);
    local_100 = vmovlpd_avx(auVar23._0_16_);
    local_48 = local_108;
    local_40 = local_100;
  }
  else {
    SpectrumTexture::SpectrumTexture
              ((SpectrumTexture *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
               (SpectrumTexture *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    auVar4 = vmovdqu64_avx512f(*local_18);
    auVar5 = vmovdqu64_avx512f(*(undefined1 (*) [64])(*local_18 + 0xc));
    auVar5 = vmovdqu64_avx512f(auVar5);
    auStack_1f8 = auVar5._52_12_;
    auVar5 = vmovdqu64_avx512f(auVar4);
    auStack_238 = auVar5._0_12_;
    local_22c = auVar5._12_52_;
    local_258 = *local_20;
    uStack_250 = local_20[1];
    uStack_248 = local_20[2];
    uStack_240 = local_20[3];
    auVar4 = vmovdqu64_avx512f(auVar5);
    auVar2._52_12_ = auStack_1f8;
    auVar2._0_52_ = local_22c;
    auVar6 = vmovdqu64_avx512f(auVar2);
    vmovdqu64_avx512f(auVar6);
    auVar5 = vmovdqu64_avx512f(auVar4);
    uVar31 = auVar5._0_4_;
    uVar32 = auVar5._4_4_;
    uVar33 = auVar5._8_4_;
    FVar34 = auVar5._12_4_;
    in_stack_fffffffffffffc58 = &local_1;
    auVar17 = ZEXT856(auVar4._8_8_);
    auVar29 = ZEXT856(auVar6._8_8_);
    ctx_01.p.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffcf4;
    ctx_01.p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffcf0;
    ctx_01.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffcf8;
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
         (float)(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffd00;
    ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)in_stack_fffffffffffffd04;
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffd08;
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffd08 >> 0x20);
    ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)in_stack_fffffffffffffd10;
    ctx_01.n.super_Tuple3<pbrt::Normal3,_float>.x =
         (float)(int)((ulong)in_stack_fffffffffffffd10 >> 0x20);
    ctx_01.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)in_stack_fffffffffffffd18;
    ctx_01.n.super_Tuple3<pbrt::Normal3,_float>.z =
         (float)(int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
    ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)in_stack_fffffffffffffd20;
    ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffd20 >> 0x20);
    ctx_01.dudx = (Float)in_stack_fffffffffffffd28._0_4_;
    ctx_01.dudy = (Float)in_stack_fffffffffffffd28._4_4_;
    ctx_01.dvdx = (Float)in_stack_fffffffffffffd28._8_4_;
    ctx_01.dvdy = (Float)(int)in_stack_fffffffffffffd34;
    ctx_01.faceIndex = (int)((ulong)in_stack_fffffffffffffd34 >> 0x20);
    SVar30 = UniversalTextureEvaluator::operator()
                       ((UniversalTextureEvaluator *)
                        CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        in_stack_fffffffffffffcc8,ctx_01,in_stack_fffffffffffffd40);
    auVar24._0_8_ = SVar30.values.values._8_8_;
    auVar24._8_56_ = auVar29;
    auVar12._0_8_ = SVar30.values.values._0_8_;
    auVar12._8_56_ = auVar17;
    auVar17 = (undefined1  [56])0x0;
    local_1d8 = vmovlpd_avx(auVar12._0_16_);
    local_1d0 = vmovlpd_avx(auVar24._0_16_);
    SVar30 = pbrt::operator*(FVar34,(SampledSpectrum *)CONCAT44(uVar32,uVar31));
    auVar25._0_8_ = SVar30.values.values._8_8_;
    auVar25._8_56_ = auVar29;
    auVar13._0_8_ = SVar30.values.values._0_8_;
    auVar13._8_56_ = auVar17;
    local_1c8 = vmovlpd_avx(auVar13._0_16_);
    local_1c0 = vmovlpd_avx(auVar25._0_16_);
    SVar30 = ClampZero((SampledSpectrum *)CONCAT44(FVar34,uVar33));
    auVar26._0_8_ = SVar30.values.values._8_8_;
    auVar26._8_56_ = auVar29;
    auVar14._0_8_ = SVar30.values.values._0_8_;
    auVar14._8_56_ = auVar17;
    local_1b8 = vmovlpd_avx(auVar14._0_16_);
    local_1b0 = vmovlpd_avx(auVar26._0_16_);
    in_stack_fffffffffffffc60 = SUB84(local_280,0);
    SpectrumTexture::SpectrumTexture
              ((SpectrumTexture *)CONCAT44(FVar34,uVar33),(SpectrumTexture *)CONCAT44(uVar32,uVar31)
              );
    auVar4 = vmovdqu64_avx512f(*local_18);
    auVar5 = vmovdqu64_avx512f(*(undefined1 (*) [64])(*local_18 + 0xc));
    auVar5 = vmovdqu64_avx512f(auVar5);
    auStack_298 = auVar5._52_12_;
    auVar5 = vmovdqu64_avx512f(auVar4);
    auVar38 = auVar5._0_12_;
    rhoEff = (SampledSpectrum *)*local_20;
    t = (BSSRDFTable *)local_20[1];
    uVar36 = local_20[2];
    this = (TabulatedBSSRDF *)local_20[3];
    auVar6 = vmovdqu64_avx512f(auVar5);
    auVar1._52_12_ = auStack_298;
    auVar1._0_52_ = auVar5._12_52_;
    auVar7 = vmovdqu64_avx512f(auVar1);
    auVar4 = vmovdqu64_avx512f(auVar7);
    sigma_a = auVar4._52_8_;
    uVar35 = auVar4._60_4_;
    auVar4 = vmovdqu64_avx512f(auVar6);
    high = auVar4._0_4_;
    low = auVar4._4_4_;
    uVar31 = auVar4._8_4_;
    uVar32 = auVar4._12_4_;
    sigma_s = auVar4._56_8_;
    auVar17 = ZEXT856(auVar6._8_8_);
    auVar29 = ZEXT856(auVar7._8_8_);
    ctx_02.p.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffcf4;
    ctx_02.p.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffcf0;
    ctx_02.p.super_Tuple3<pbrt::Point3,_float>.z = (float)(int)in_stack_fffffffffffffcf8;
    ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
         (float)(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
    ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffd00;
    ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)in_stack_fffffffffffffd04;
    ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = rhoEff;
    ctx_02._32_8_ = t;
    ctx_02.n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)uVar36;
    ctx_02.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)(int)((ulong)uVar36 >> 0x20);
    ctx_02.uv.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)this;
    ctx_02.dudx = (Float)auVar38._0_4_;
    ctx_02.dudy = (Float)auVar38._4_4_;
    ctx_02.dvdx = (Float)auVar38._8_4_;
    ctx_02.dvdy = (Float)(int)auVar5._12_8_;
    ctx_02.faceIndex = (int)((ulong)auVar5._12_8_ >> 0x20);
    SVar30 = UniversalTextureEvaluator::operator()
                       ((UniversalTextureEvaluator *)
                        CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                        in_stack_fffffffffffffcc8,ctx_02,auVar5._24_32_);
    eta = (Float)((ulong)uVar36 >> 0x20);
    auVar27._0_8_ = SVar30.values.values._8_8_;
    auVar27._8_56_ = auVar29;
    auVar15._0_8_ = SVar30.values.values._0_8_;
    auVar15._8_56_ = auVar17;
    local_278 = vmovlpd_avx(auVar15._0_16_);
    local_270 = vmovlpd_avx(auVar27._0_16_);
    SVar30 = Clamp<int,int>((SampledSpectrum *)CONCAT44(uVar32,uVar31),low,high);
    auVar28._0_8_ = SVar30.values.values._8_8_;
    auVar28._8_56_ = auVar29;
    auVar16._0_8_ = SVar30.values.values._0_8_;
    auVar16._8_56_ = auVar17;
    local_268 = vmovlpd_avx(auVar16._0_16_);
    local_260 = vmovlpd_avx(auVar28._0_16_);
    SubsurfaceFromDiffuse
              (t,rhoEff,(SampledSpectrum *)CONCAT44(in_stack_fffffffffffffc24,uVar35),sigma_a,
               sigma_s);
  }
  po.super_Tuple3<pbrt::Point3,_float>.z = fVar37;
  po.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_1;
  ns.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffc80;
  ns.super_Tuple3<pbrt::Normal3,_float>._0_8_ = in_stack_fffffffffffffc78;
  wo.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc60;
  wo.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffffc58;
  TabulatedBSSRDF::TabulatedBSSRDF
            (this,po,ns,wo,eta,(SampledSpectrum *)t,rhoEff,
             (BSSRDFTable *)CONCAT44(in_stack_fffffffffffffc24,uVar35));
  return (TabulatedBSSRDF *)param_1;
}

Assistant:

PBRT_CPU_GPU TabulatedBSSRDF GetBSSRDF(TextureEvaluator texEval,
                                           const MaterialEvalContext &ctx,
                                           SampledWavelengths &lambda) const {
        SampledSpectrum sig_a, sig_s;
        if (sigma_a && sigma_s) {
            // Evaluate textures for $\sigma_\roman{a}$ and $\sigma_\roman{s}$
            sig_a = ClampZero(scale * texEval(sigma_a, ctx, lambda));
            sig_s = ClampZero(scale * texEval(sigma_s, ctx, lambda));

        } else {
            // Compute _sig_a_ and _sig_s_ from reflectance and mfp
            DCHECK(reflectance && mfp);
            SampledSpectrum mfree = ClampZero(scale * texEval(mfp, ctx, lambda));
            SampledSpectrum r = Clamp(texEval(reflectance, ctx, lambda), 0, 1);
            SubsurfaceFromDiffuse(table, r, mfree, &sig_a, &sig_s);
        }
        return TabulatedBSSRDF(ctx.p, ctx.ns, ctx.wo, eta, sig_a, sig_s, &table);
    }